

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

int32_t helicsDataBufferFillFromTime(HelicsDataBuffer data,HelicsTime value)

{
  Message *pMVar1;
  SmallBuffer *ptr;
  int64_t val;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar1 = getMessageObj(data,(HelicsError *)0x0);
    if (pMVar1 == (Message *)0x0) {
      return 0;
    }
    data = &pMVar1->data;
  }
  val = 0x7fffffffffffffff;
  if (value <= -9223372036.854765) {
    val = -0x7fffffffffffffff;
  }
  else if (value < 9223372036.854765) {
    val = (int64_t)(value * 1000000000.0 +
                   *(double *)(&DAT_004296c0 + (ulong)(0.0 <= value * 1000000000.0) * 8));
  }
  helics::SmallBuffer::reserve((SmallBuffer *)data,0x10);
  ((SmallBuffer *)data)->bufferSize = 0x10;
  helics::detail::convertToBinary(((SmallBuffer *)data)->heap,val);
  return (int32_t)((SmallBuffer *)data)->bufferSize;
}

Assistant:

int32_t helicsDataBufferFillFromTime(HelicsDataBuffer data, HelicsTime value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<int64_t>::convert(helics::Time(value).getBaseTimeCode(), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}